

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Reader * __thiscall
capnp::DynamicValue::Builder::asReader(Reader *__return_storage_ptr__,Builder *this)

{
  bool bVar1;
  undefined2 uVar2;
  int64_t iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Fault f;
  Fault local_10;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar3 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_003158eb;
  case UINT:
    iVar3 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_003158eb:
    (__return_storage_ptr__->field_1).intValue = iVar3;
    break;
  case FLOAT:
    iVar3 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar3;
    break;
  case TEXT:
    uVar4 = *(undefined4 *)((long)&this->field_1 + 8);
    uVar5 = *(undefined4 *)((long)&this->field_1 + 0xc);
    uVar6 = *(undefined4 *)((long)&this->field_1 + 0x10);
    uVar7 = *(undefined4 *)((long)&this->field_1 + 0x14);
    __return_storage_ptr__->type = TEXT;
    goto LAB_00315921;
  case DATA:
    uVar4 = *(undefined4 *)&this->field_1;
    uVar5 = *(undefined4 *)((long)&this->field_1 + 4);
    uVar6 = *(undefined4 *)((long)&this->field_1 + 8);
    uVar7 = *(undefined4 *)((long)&this->field_1 + 0xc);
    __return_storage_ptr__->type = DATA;
LAB_00315921:
    *(undefined4 *)&__return_storage_ptr__->field_1 = uVar4;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 4) = uVar5;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) = uVar6;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0xc) = uVar7;
    break;
  case LIST:
    DynamicList::Builder::asReader
              (&(__return_storage_ptr__->field_1).listValue,&(this->field_1).listValue);
    __return_storage_ptr__->type = LIST;
    break;
  case ENUM:
    iVar3 = (this->field_1).intValue;
    uVar2 = *(undefined2 *)&(this->field_1).listValue.schema.elementType.field_4;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar3;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    DynamicStruct::Builder::asReader
              (&(__return_storage_ptr__->field_1).structValue,&(this->field_1).structValue);
    __return_storage_ptr__->type = STRUCT;
    break;
  case CAPABILITY:
    DynamicValue::Reader::Reader(__return_storage_ptr__,&(this->field_1).capabilityValue);
    break;
  case ANY_POINTER:
    capnp::_::PointerBuilder::asReader((PointerBuilder *)&(this->field_1).textValue);
    __return_storage_ptr__->type = ANY_POINTER;
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
              (&local_10,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x682,FAILED,(char *)0x0,"\"Missing switch case.\"",
               (char (*) [21])"Missing switch case.");
    kj::_::Debug::Fault::fatal(&local_10);
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader DynamicValue::Builder::asReader() const {
  switch (type) {
    case UNKNOWN: return Reader();
    case VOID: return Reader(voidValue);
    case BOOL: return Reader(boolValue);
    case INT: return Reader(intValue);
    case UINT: return Reader(uintValue);
    case FLOAT: return Reader(floatValue);
    case TEXT: return Reader(textValue.asReader());
    case DATA: return Reader(dataValue.asReader());
    case LIST: return Reader(listValue.asReader());
    case ENUM: return Reader(enumValue);
    case STRUCT: return Reader(structValue.asReader());
    case CAPABILITY: return Reader(capabilityValue);
    case ANY_POINTER: return Reader(anyPointerValue.asReader());
  }
  KJ_FAIL_ASSERT("Missing switch case.");
  return Reader();
}